

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_dry_free(llama_sampler *smpl)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = smpl->ctx;
  if (pvVar1 != (void *)0x0) {
    pvVar2 = *(void **)((long)pvVar1 + 0xc0);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)pvVar1 + 0xd0) - (long)pvVar2);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)pvVar1 + 0x68));
    pvVar2 = *(void **)((long)pvVar1 + 0x50);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)pvVar1 + 0x60) - (long)pvVar2);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   *)((long)pvVar1 + 0x18));
  }
  operator_delete(pvVar1,0xd8);
  return;
}

Assistant:

static void llama_sampler_dry_free(struct llama_sampler * smpl) {
    delete (llama_sampler_dry *) smpl->ctx;
}